

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database_manager.cpp
# Opt level: O1

void __thiscall
duckdb::DatabaseManager::ResetDatabases
          (DatabaseManager *this,
          unique_ptr<duckdb::TaskScheduler,_std::default_delete<duckdb::TaskScheduler>,_true>
          *scheduler)

{
  undefined8 *puVar1;
  pointer this_00;
  vector<std::reference_wrapper<duckdb::AttachedDatabase>,_true> *__range1;
  reference_wrapper<duckdb::AttachedDatabase> *database;
  undefined8 *puVar2;
  vector<std::reference_wrapper<duckdb::AttachedDatabase>,_true> result;
  undefined8 *local_68;
  undefined8 *puStack_60;
  undefined8 local_58;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  local_68 = (undefined8 *)0x0;
  puStack_60 = (undefined8 *)0x0;
  local_58 = 0;
  this_00 = unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>,_true>::
            operator->(&this->databases);
  local_48._8_8_ = 0;
  pcStack_30 = ::std::
               _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/main/database_manager.cpp:221:18)>
               ::_M_invoke;
  local_38 = ::std::
             _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/main/database_manager.cpp:221:18)>
             ::_M_manager;
  local_48._M_unused._M_object = &local_68;
  CatalogSet::Scan(this_00,(function<void_(duckdb::CatalogEntry_&)> *)&local_48);
  puVar2 = local_68;
  puVar1 = puStack_60;
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
    puVar2 = local_68;
    puVar1 = puStack_60;
  }
  for (; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    AttachedDatabase::Close((AttachedDatabase *)*puVar2);
  }
  ::std::__uniq_ptr_impl<duckdb::TaskScheduler,_std::default_delete<duckdb::TaskScheduler>_>::reset
            ((__uniq_ptr_impl<duckdb::TaskScheduler,_std::default_delete<duckdb::TaskScheduler>_> *)
             scheduler,(pointer)0x0);
  ::std::__uniq_ptr_impl<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>_>::reset
            ((__uniq_ptr_impl<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>_> *)
             &this->databases,(pointer)0x0);
  if (local_68 != (undefined8 *)0x0) {
    operator_delete(local_68);
  }
  return;
}

Assistant:

void DatabaseManager::ResetDatabases(unique_ptr<TaskScheduler> &scheduler) {
	vector<reference<AttachedDatabase>> result;
	databases->Scan([&](CatalogEntry &entry) { result.push_back(entry.Cast<AttachedDatabase>()); });
	for (auto &database : result) {
		database.get().Close();
	}
	scheduler.reset();
	databases.reset();
}